

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O2

void __thiscall wasm::StackIROptimizer::local2Stack(StackIROptimizer *this)

{
  Op OVar1;
  uint setIndex;
  pointer ppSVar2;
  StackInst *inst;
  _Base_ptr p_Var3;
  uint getIndex;
  Index IVar4;
  size_type sVar5;
  ulong uVar6;
  LocalSet *set;
  Sets *pSVar7;
  SetInfluences *pSVar8;
  _Base_ptr p_Var9;
  StackIROptimizer *this_00;
  ulong uVar10;
  uint uVar11;
  bool bVar12;
  undefined1 local_230 [8];
  LazyLocalGraph localGraph;
  unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
  deferredGets;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  savedValues;
  value_type_conflict2 local_64;
  LocalGet *pLStack_60;
  Index null;
  LocalGet *get;
  LocalGet *pLStack_50;
  PassOptions *local_48;
  uint local_34;
  
  LazyLocalGraph::LazyLocalGraph
            ((LazyLocalGraph *)local_230,this->func,(Module *)0x0,
             (optional<wasm::Expression::Id>)0x0);
  this_00 = (StackIROptimizer *)&localGraph.flower;
  findStringViewDeferredGets
            ((unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
              *)this_00,this);
  local_64 = 0xffffffff;
  get = (LocalGet *)0x0;
  pLStack_50 = (LocalGet *)0x0;
  local_48 = (PassOptions *)0x0;
  deferredGets._M_h._M_single_bucket = (__node_base_ptr)0x0;
  savedValues.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_34 = 0;
  do {
    ppSVar2 = (this->insts->
              super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->insts->
                      super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3) <=
        (ulong)local_34) {
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)&deferredGets._M_h._M_single_bucket);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&get);
      std::
      _Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&localGraph.flower);
      LazyLocalGraph::~LazyLocalGraph((LazyLocalGraph *)local_230);
      return;
    }
    inst = ppSVar2[local_34];
    if (inst != (StackInst *)0x0) {
      IVar4 = getNumConsumedValues(this_00,inst);
      while (bVar12 = IVar4 != 0, IVar4 = IVar4 - 1, bVar12) {
        if (pLStack_50 == get) {
          __assert_fail("values.size() > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack-opts.cpp"
                        ,0xb2,"void wasm::StackIROptimizer::local2Stack()");
        }
        while (pLStack_50 = (LocalGet *)&pLStack_50[-1].field_0x14, *(int *)pLStack_50 != -1) {
          if (pLStack_50 == get) {
            __assert_fail("values.size() > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack-opts.cpp"
                          ,0xb7,"void wasm::StackIROptimizer::local2Stack()");
          }
        }
      }
      OVar1 = inst->op;
      if (OVar1 < (TryTableEnd|BlockBegin)) {
        if ((0x58a4U >> (OVar1 & 0x1f) & 1) == 0) {
          if ((0x214aU >> (OVar1 & 0x1f) & 1) == 0) {
            if (OVar1 != Basic) goto LAB_00cf812e;
          }
          else {
            this_00 = (StackIROptimizer *)&deferredGets._M_h._M_single_bucket;
            std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)this_00,(value_type *)&get);
            if (pLStack_50 != get) {
              pLStack_50 = get;
            }
          }
        }
        else {
          if ((pointer)deferredGets._M_h._M_single_bucket ==
              savedValues.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            __assert_fail("!savedValues.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack-opts.cpp"
                          ,0xc4,"void wasm::StackIROptimizer::local2Stack()");
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&get,
                     savedValues.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + -1);
          savedValues.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               savedValues.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + -1;
          this_00 = (StackIROptimizer *)
                    savedValues.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&(savedValues.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        }
      }
      else {
LAB_00cf812e:
        if (pLStack_50 != get) {
          pLStack_50 = get;
        }
      }
      uVar6 = (inst->type).id;
      if (uVar6 < 2) {
        if ((uVar6 == 0) && (inst->origin->_id == LocalSetId)) {
          this_00 = (StackIROptimizer *)&get;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&get,&local_34);
        }
      }
      else {
        pLStack_60 = (LocalGet *)inst->origin;
        if ((((LocalGet *)inst->origin)->super_SpecificExpression<(wasm::Expression::Id)8>).
            super_Expression._id != LocalGetId) {
          pLStack_60 = (LocalGet *)0x0;
        }
        if ((((pLStack_60 != (LocalGet *)0x0) && ((6 < uVar6 & (byte)uVar6) == 0)) &&
            (sVar5 = std::
                     _Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::count((_Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                              *)&localGraph.flower,&stack0xffffffffffffffa0), getIndex = local_34,
            sVar5 == 0)) && ((long)pLStack_50 - (long)get != 0)) {
          uVar6 = (ulong)local_34;
          uVar11 = (uint)((ulong)((long)pLStack_50 - (long)get) >> 2);
          do {
            uVar11 = uVar11 - 1;
            setIndex = *(uint *)(&(get->super_SpecificExpression<(wasm::Expression::Id)8>).
                                  super_Expression._id + (ulong)uVar11 * 4);
            uVar10 = (ulong)setIndex;
            if (uVar10 == 0xffffffff) break;
            set = Expression::cast<wasm::LocalSet>
                            ((this->insts->
                             super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar10]->origin);
            if (set->index == pLStack_60->index) {
              pSVar7 = LazyLocalGraph::getSets((LazyLocalGraph *)local_230,pLStack_60);
              p_Var3 = (_Base_ptr)
                       (pSVar7->
                       super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                       ).flexible._M_t._M_impl.super__Rb_tree_header._M_node_count;
              p_Var9 = p_Var3;
              if (p_Var3 == (_Base_ptr)0x0) {
                p_Var9 = (_Base_ptr)
                         (pSVar7->
                         super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                         ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
              }
              if (p_Var9 == (_Base_ptr)0x1) {
                p_Var9 = p_Var3;
                if (p_Var3 != (_Base_ptr)0x0) {
                  p_Var9 = (pSVar7->
                           super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                           ).flexible._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                }
                p_Var9 = p_Var9 + 1;
                if (p_Var3 == (_Base_ptr)0x0) {
                  p_Var9 = (_Base_ptr)
                           &(pSVar7->
                            super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                            ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage;
                }
                if (((*(LocalSet **)p_Var9 == set) &&
                    (pSVar8 = LazyLocalGraph::getSetInfluences((LazyLocalGraph *)local_230,set),
                    (pSVar8->_M_h)._M_element_count == 1)) &&
                   (this_00 = this, bVar12 = canRemoveSetGetPair(this,setIndex,getIndex), bVar12)) {
                  if ((LocalGet *)(pSVar8->_M_h)._M_before_begin._M_nxt[1]._M_nxt != pLStack_60) {
                    __assert_fail("*setInfluences.begin() == get",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack-opts.cpp"
                                  ,0xeb,"void wasm::StackIROptimizer::local2Stack()");
                  }
                  (this->insts->
                  super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl
                  .super__Vector_impl_data._M_start[uVar10] = (StackInst *)0x0;
                  (this->insts->
                  super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl
                  .super__Vector_impl_data._M_start[uVar6] = (StackInst *)0x0;
                  *(undefined4 *)
                   (&(get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id +
                   (ulong)uVar11 * 4) = 0xffffffff;
                  goto LAB_00cf811c;
                }
              }
            }
          } while (uVar11 != 0);
        }
        this_00 = (StackIROptimizer *)&get;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&get,&local_64);
      }
    }
LAB_00cf811c:
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void StackIROptimizer::local2Stack() {
  // We use the localGraph to tell us if a get-set pair is indeed a set that is
  // read by that get, and only that get. Note that we run this on Binaryen IR,
  // so we are assuming that no previous opt has changed the interaction of
  // local operations.
  //
  // We use a lazy graph here as we only query in the rare case when we find a
  // set/get pair that looks optimizable.
  LazyLocalGraph localGraph(func);
  // The binary writing of StringWTF16Get and StringSliceWTF is optimized to use
  // fewer scratch locals when their operands are already LocalGets. To avoid
  // interfering with that optimization, we have to avoid removing such
  // LocalGets.
  auto deferredGets = findStringViewDeferredGets();

  // We maintain a stack of relevant values. This contains:
  //  * a null for each actual value that the value stack would have
  //  * an index of each LocalSet that *could* be on the value
  //    stack at that location.
  const Index null = -1;
  std::vector<Index> values;
  // We also maintain a stack of values vectors for control flow,
  // saving the stack as we enter and restoring it when we exit.
  std::vector<std::vector<Index>> savedValues;
#ifdef STACK_OPT_DEBUG
  std::cout << "func: " << func->name << '\n' << insts << '\n';
#endif
  for (Index instIndex = 0; instIndex < insts.size(); instIndex++) {
    auto* inst = insts[instIndex];
    if (!inst) {
      continue;
    }
    // First, consume values from the stack as required.
    auto consumed = getNumConsumedValues(inst);
#ifdef STACK_OPT_DEBUG
    std::cout << "  " << instIndex << " : " << *inst << ", " << values.size()
              << " on stack, will consume " << consumed << "\n    ";
    for (auto s : values)
      std::cout << s << ' ';
    std::cout << '\n';
#endif
    // TODO: currently we run dce before this, but if we didn't, we'd need
    //       to handle unreachable code here - it's ok to pop multiple values
    //       there even if the stack is at size 0.
    while (consumed > 0) {
      assert(values.size() > 0);
      // Whenever we hit a possible stack value, kill it - it would
      // be consumed here, so we can never optimize to it.
      while (values.back() != null) {
        values.pop_back();
        assert(values.size() > 0);
      }
      // Finally, consume the actual value that is consumed here.
      values.pop_back();
      consumed--;
    }
    // After consuming, we can see what to do with this. First, handle
    // control flow.
    if (isControlFlowBegin(inst)) {
      // Save the stack for when we end this control flow.
      savedValues.push_back(values); // TODO: optimize copies
      values.clear();
    } else if (isControlFlowEnd(inst)) {
      assert(!savedValues.empty());
      values = savedValues.back();
      savedValues.pop_back();
    } else if (isControlFlow(inst)) {
      // Otherwise, in the middle of control flow, just clear it
      values.clear();
    }
    // This is something we should handle, look into it.
    if (inst->type.isConcrete()) {
      bool optimized = false;
      // Do not optimize multivalue locals, since those will be better
      // optimized when they are visited in the binary writer and this
      // optimization would intefere with that one.
      if (auto* get = inst->origin->dynCast<LocalGet>();
          get && inst->type.isSingle() && !deferredGets.count(get)) {
        // Use another local to clarify what instIndex means in this scope.
        auto getIndex = instIndex;

        // This is a potential optimization opportunity! See if we
        // can reach the set.
        if (values.size() > 0) {
          Index j = values.size() - 1;
          while (1) {
            // If there's an actual value in the way, we've failed.
            auto setIndex = values[j];
            if (setIndex == null) {
              break;
            }
            auto* set = insts[setIndex]->origin->cast<LocalSet>();
            if (set->index == get->index) {
              // This might be a proper set-get pair, where the set is
              // used by this get and nothing else, check that.
              auto& sets = localGraph.getSets(get);
              if (sets.size() == 1 && *sets.begin() == set) {
                auto& setInfluences = localGraph.getSetInfluences(set);
                // If this has the proper value of 1, also do the potentially-
                // expensive check of whether we can remove this pair at all.
                if (setInfluences.size() == 1 &&
                    canRemoveSetGetPair(setIndex, getIndex)) {
                  assert(*setInfluences.begin() == get);
                  // Do it! The set and the get can go away, the proper
                  // value is on the stack.
#ifdef STACK_OPT_DEBUG
                  std::cout << "  stackify the get\n";
#endif
                  insts[setIndex] = nullptr;
                  insts[getIndex] = nullptr;
                  // Continuing on from here, replace this on the stack
                  // with a null, representing a regular value. We
                  // keep possible values above us active - they may
                  // be optimized later, as they would be pushed after
                  // us, and used before us, so there is no conflict.
                  values[j] = null;
                  optimized = true;
                  break;
                }
              }
            }
            // We failed here. Can we look some more?
            if (j == 0) {
              break;
            }
            j--;
          }
        }
      }
      if (!optimized) {
        // This is an actual regular value on the value stack.
        values.push_back(null);
      }
    } else if (inst->origin->is<LocalSet>() && inst->type == Type::none) {
      // This set is potentially optimizable later, add to stack.
      values.push_back(instIndex);
    }
  }
}